

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycled.hpp
# Opt level: O1

void __thiscall
Lib::
Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
::~Recycled(Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
            *this)

{
  _Head_base<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_*,_false>
  this_00;
  Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
  *in_RAX;
  Stack<std::unique_ptr<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>_>_>
  *this_01;
  _Head_base<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_*,_false>
  local_18;
  
  this_00._M_head_impl =
       (this->_self)._M_t.
       super___uniq_ptr_impl<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_*,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>_>
       .
       super__Head_base<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_*,_false>
       ._M_head_impl;
  local_18._M_head_impl = in_RAX;
  if ((this_00._M_head_impl !=
       (Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
        *)0x0) &&
     (((((this_00._M_head_impl)->_nodeIterators)._capacity != 0 ||
        ((this_00._M_head_impl)->_svStack)._capacity != 0 ||
       (((this_00._M_head_impl)->_bdStack)._capacity != 0)) &&
      (Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>>::Rhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,Indexing::RetrievalAlgorithms::VarBanksN<0u>>>,Lib::DefaultReset,Lib::DefaultKeepRecycled>
       ::memAlive == '\x01')))) {
    Indexing::
    SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs>
    ::
    Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
    ::reset(this_00._M_head_impl);
    this_01 = mem();
    local_18._M_head_impl =
         (this->_self)._M_t.
         super___uniq_ptr_impl<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_*,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>_>
         .
         super__Head_base<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_*,_false>
         ._M_head_impl;
    (this->_self)._M_t.
    super___uniq_ptr_impl<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_*,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>_>
    .
    super__Head_base<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_*,_false>
    ._M_head_impl =
         (Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
          *)0x0;
    if (this_01->_cursor == this_01->_end) {
      Stack<std::unique_ptr<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>_>_>
      ::expand(this_01);
    }
    (this_01->_cursor->_M_t).
    super___uniq_ptr_impl<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_*,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>_>
    .
    super__Head_base<0UL,_Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_*,_false>
    ._M_head_impl = local_18._M_head_impl;
    local_18._M_head_impl =
         (Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
          *)0x0;
    this_01->_cursor = this_01->_cursor + 1;
    std::
    unique_ptr<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>_>
    ::~unique_ptr((unique_ptr<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>_>
                   *)&local_18);
  }
  std::
  unique_ptr<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>_>_>
  ::~unique_ptr(&this->_self);
  return;
}

Assistant:

~Recycled()
  {
    if (IF_USE_PTRS(_self, true) && _keep(self()) && memAlive) {
      _reset(self());
      mem().push(std::move(_self));
    }
  }